

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hdr_histogram.c
# Opt level: O2

_Bool hdr_record_corrected_values_atomic
                (hdr_histogram *h,int64_t value,int64_t count,int64_t expected_interval)

{
  _Bool _Var1;
  bool bVar2;
  long value_00;
  
  _Var1 = hdr_record_values_atomic(h,value,count);
  if (_Var1) {
    value_00 = value - expected_interval;
    bVar2 = true;
    if ((value_00 != 0 && expected_interval <= value) && 0 < expected_interval) {
      do {
        bVar2 = value_00 < expected_interval;
        if (value_00 < expected_interval) {
          return bVar2;
        }
        _Var1 = hdr_record_values_atomic(h,value_00,count);
        value_00 = value_00 - expected_interval;
      } while (_Var1);
    }
  }
  else {
    bVar2 = false;
  }
  return bVar2;
}

Assistant:

bool hdr_record_corrected_values_atomic(struct hdr_histogram* h, int64_t value, int64_t count, int64_t expected_interval)
{
    int64_t missing_value;

    if (!hdr_record_values_atomic(h, value, count))
    {
        return false;
    }

    if (expected_interval <= 0 || value <= expected_interval)
    {
        return true;
    }

    missing_value = value - expected_interval;
    for (; missing_value >= expected_interval; missing_value -= expected_interval)
    {
        if (!hdr_record_values_atomic(h, missing_value, count))
        {
            return false;
        }
    }

    return true;
}